

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_global(Context *ctx,RegisterType regtype,int regnum)

{
  int iVar1;
  char local_58 [8];
  char varname [64];
  int regnum_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  varname._56_4_ = regnum;
  varname._60_4_ = regtype;
  get_GLSL_varname_in_buf(ctx,regtype,regnum,local_58,0x40);
  push_output(ctx,&ctx->globals);
  switch(varname._60_4_) {
  case 0:
    output_line(ctx,"vec4 %s;",local_58);
    break;
  default:
    fail(ctx,"BUG: we used a register we don\'t know how to define.");
    break;
  case 3:
    iVar1 = shader_is_vertex(ctx);
    if (iVar1 == 0) {
      iVar1 = shader_is_pixel(ctx);
      if ((iVar1 != 0) && (iVar1 = shader_version_atleast(ctx,'\x01','\x04'), iVar1 == 0)) {
        if (ctx->profile_supports_glsles == 0) {
          output_line(ctx,"vec4 %s = gl_TexCoord[%d];",local_58,(ulong)(uint)varname._56_4_);
        }
        else {
          output_line(ctx,"vec4 %s = v_TexCoord[%d];",local_58,(ulong)(uint)varname._56_4_);
        }
      }
    }
    else {
      output_line(ctx,"ivec4 %s;",local_58);
    }
    break;
  case 0xf:
    break;
  case 0x12:
    break;
  case 0x13:
    output_line(ctx,"bvec4 %s;",local_58);
  }
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_global(Context *ctx, RegisterType regtype, int regnum)
{
    char varname[64];
    get_GLSL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->globals);
    switch (regtype)
    {
        case REG_TYPE_ADDRESS:
            if (shader_is_vertex(ctx))
                output_line(ctx, "ivec4 %s;", varname);
            else if (shader_is_pixel(ctx))  // actually REG_TYPE_TEXTURE.
            {
                // We have to map texture registers to temps for ps_1_1, since
                //  they work like temps, initialize with tex coords, and the
                //  ps_1_1 TEX opcode expects to overwrite it.
                if (!shader_version_atleast(ctx, 1, 4))
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        output_line(ctx, "vec4 %s = v_TexCoord[%d];",
                                    varname, regnum);
                    else
#endif
                    output_line(ctx, "vec4 %s = gl_TexCoord[%d];",
                                varname, regnum);
                } // if
            } // else if
            break;
        case REG_TYPE_PREDICATE:
            output_line(ctx, "bvec4 %s;", varname);
            break;
        case REG_TYPE_TEMP:
            output_line(ctx, "vec4 %s;", varname);
            break;
        case REG_TYPE_LOOP:
            break; // no-op. We declare these in for loops at the moment.
        case REG_TYPE_LABEL:
            break; // no-op. If we see it here, it means we optimized it out.
        default:
            fail(ctx, "BUG: we used a register we don't know how to define.");
            break;
    } // switch
    pop_output(ctx);
}